

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
::delete_db_node_ptr_at_scope_exit::~delete_db_node_ptr_at_scope_exit
          (delete_db_node_ptr_at_scope_exit *this)

{
  node_type nVar1;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *leaf;
  inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_ptr;
  inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_ptr_00;
  inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_ptr_01;
  inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode_ptr_02;
  undefined1 local_60 [8];
  db_inode_unique_ptr<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte>_>_> r_4;
  db_inode_unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte>_>_> r_3;
  db_inode_unique_ptr<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte>_>_> r_2;
  db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte>_>_> r_1;
  basic_db_leaf_unique_ptr<key_type,_value_type,_header_type,_unodb::db> r;
  delete_db_node_ptr_at_scope_exit *this_local;
  
  nVar1 = basic_node_ptr<unodb::detail::node_header>::type(&this->node_ptr);
  switch(nVar1) {
  case LEAF:
    leaf = basic_node_ptr<unodb::detail::node_header>::
           ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>*>
                     (&this->node_ptr);
    make_db_leaf_ptr((basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
                      *)&r_1._M_t.
                         super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         .
                         super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                     ,leaf,this->db);
    std::
    unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&r_1._M_t.
                      super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                 );
    break;
  case I4:
    inode_ptr = basic_node_ptr<unodb::detail::node_header>::
                ptr<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                          (&this->node_ptr);
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                *)&r_2._M_t.
                   super___uniq_ptr_impl<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   .
                   super__Head_base<0UL,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
               ,inode_ptr,this->db);
    std::
    unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&r_2._M_t.
                      super___uniq_ptr_impl<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                 );
    break;
  case I16:
    inode_ptr_00 = basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                             (&this->node_ptr);
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::inode_16<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                *)&r_3._M_t.
                   super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   .
                   super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
               ,inode_ptr_00,this->db);
    std::
    unique_ptr<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&r_3._M_t.
                      super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                 );
    break;
  case I48:
    inode_ptr_01 = basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                             (&this->node_ptr);
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                *)&r_4._M_t.
                   super___uniq_ptr_impl<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   .
                   super__Head_base<0UL,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
               ,inode_ptr_01,this->db);
    std::
    unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)&r_4._M_t.
                      super___uniq_ptr_impl<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                 );
    break;
  case I256:
    inode_ptr_02 = basic_node_ptr<unodb::detail::node_header>::
                   ptr<unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>*>
                             (&this->node_ptr);
    basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
    ::
    make_db_inode_unique_ptr<unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
                *)local_60,inode_ptr_02,this->db);
    std::
    unique_ptr<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_60);
    break;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x1c8,"~delete_db_node_ptr_at_scope_exit");
  }
  return;
}

Assistant:

~delete_db_node_ptr_at_scope_exit() noexcept {
      switch (node_ptr.type()) {
        case node_type::LEAF: {
          const auto r{
              make_db_leaf_ptr(node_ptr.template ptr<leaf_type *>(), db)};
          return;
        }
        case node_type::I4: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode4_type *>(), db)};
          return;
        }
        case node_type::I16: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode16_type *>(), db)};
          return;
        }
        case node_type::I48: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode48_type *>(), db)};
          return;
        }
        case node_type::I256: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode256_type *>(), db)};
          return;
        }
      }
      UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
    }